

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void vkt::shaderexecutor::addScalarFactory<vkt::shaderexecutor::Functions::Tanh>
               (BuiltinFuncs *funcs,string *name)

{
  string *this;
  ulong uVar1;
  Tanh *pTVar2;
  GenFuncCaseFactory<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  GenFuncs<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_68;
  SharedPtr<const_vkt::shaderexecutor::CaseFactory> local_48;
  string local_38 [32];
  string *local_18;
  string *name_local;
  BuiltinFuncs *funcs_local;
  
  local_18 = name;
  name_local = (string *)funcs;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    pTVar2 = instance<vkt::shaderexecutor::Functions::Tanh>();
    (*(pTVar2->
      super_DerivedFunc<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
      ).
      super_Func<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
      .super_FuncBase._vptr_FuncBase[2])(local_38);
    std::__cxx11::string::operator=((string *)name,local_38);
    std::__cxx11::string::~string(local_38);
  }
  this = name_local;
  this_00 = (GenFuncCaseFactory<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
             *)operator_new(0x48);
  makeVectorizedFuncs<vkt::shaderexecutor::Functions::Tanh>();
  GenFuncCaseFactory<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  ::GenFuncCaseFactory(this_00,&local_68,name);
  de::SharedPtr<const_vkt::shaderexecutor::CaseFactory>::SharedPtr(&local_48,(CaseFactory *)this_00)
  ;
  BuiltinFuncs::addFactory((BuiltinFuncs *)this,&local_48);
  de::SharedPtr<const_vkt::shaderexecutor::CaseFactory>::~SharedPtr(&local_48);
  return;
}

Assistant:

void addScalarFactory(BuiltinFuncs& funcs, string name = "")
{
	if (name.empty())
		name = instance<F>().getName();

	funcs.addFactory(SharedPtr<const CaseFactory>(new GenFuncCaseFactory<typename F::Sig>(makeVectorizedFuncs<F>(), name)));
}